

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_1::GridRenderCase::iterate(GridRenderCase *this)

{
  ostringstream *poVar1;
  uint uVar2;
  RenderContext *context;
  bool bVar3;
  pointer pSVar4;
  int y;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  TestLog *pTVar7;
  TestError *this_00;
  runtime_error *this_01;
  void *__n;
  ConstPixelBufferAccess *pCVar8;
  LogImageSet *__return_storage_ptr__;
  void *pvVar9;
  int x;
  int iVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  char *description;
  bool bVar11;
  long lVar12;
  Surface *this_02;
  int ndx;
  long lVar13;
  allocator<char> local_46e;
  allocator<char> local_46d;
  allocator<char> local_46c;
  allocator<char> local_46b;
  allocator<char> local_46a;
  allocator<char> local_469;
  GridRenderCase *local_468;
  void *local_460;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> renderedLayers;
  undefined1 local_440 [32];
  Surface errorMask;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  ConstPixelBufferAccess local_368;
  ConstPixelBufferAccess local_340;
  undefined1 local_318 [384];
  VertexArray vao;
  LogImageSet local_100;
  LogImage local_c0;
  
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
            (&renderedLayers,(long)this->m_numLayers,(allocator_type *)local_318);
  lVar12 = 0;
  for (lVar13 = 0; lVar13 < this->m_numLayers; lVar13 = lVar13 + 1) {
    tcu::Surface::setSize
              ((Surface *)
               ((long)&(renderedLayers.
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_width + lVar12),0x100,0x100);
    lVar12 = lVar12 + 0x18;
  }
  local_318._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_318 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar5);
  iVar5 = (**(code **)(lVar12 + 0x780))((this->m_program->m_program).m_program,"a_position");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  if (iVar5 != -1) {
    (**(code **)(lVar12 + 0x1a00))
              (0,0,(renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                    _M_impl.super__Vector_impl_data._M_start)->m_width,
               (renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_height);
    (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                    ,0x157);
    (**(code **)(lVar12 + 0xd8))(vao.super_ObjectWrapper.m_object);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"bind vao",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                    ,0x15a);
    (**(code **)(lVar12 + 0x1680))((this->m_program->m_program).m_program);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                    ,0x15d);
    (**(code **)(lVar12 + 0xfd8))(0x8e72,1);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                    ,0x160);
    (**(code **)(lVar12 + 0x1858))(0,0,0,0x3f800000,iVar5);
    (**(code **)(lVar12 + 0x188))(0x4000);
    (**(code **)(lVar12 + 0x538))(0xe,0,1);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    if (dVar6 != 0x505) {
      glu::checkError(dVar6,"draw patches",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                      ,0x172);
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)local_318,
                 renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_318);
      dVar6 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar6,"read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sTessellationGeometryInteractionTests.cpp"
                      ,0x178);
      local_468 = this;
      glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
      bVar11 = true;
      pvVar9 = (void *)0x0;
      while (pSVar4 = renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (long)pvVar9 < (long)local_468->m_numLayers) {
        __n = pvVar9;
        local_460 = pvVar9;
        tcu::Surface::Surface
                  (&errorMask,
                   renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pvVar9].m_width,
                   renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pvVar9].m_height);
        tcu::Surface::getAccess((PixelBufferAccess *)local_318,&errorMask);
        vao.super_ObjectWrapper.m_gl = (Functions *)0x3f80000000000000;
        vao.super_ObjectWrapper.m_traits = (ObjectTraits *)0x3f80000000000000;
        tcu::clear((PixelBufferAccess *)local_318,(Vec4 *)&vao);
        local_318._0_8_ =
             ((local_468->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_318 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Verifying output layer ");
        std::ostream::operator<<(poVar1,(int)local_460);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_318,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_02 = pSVar4 + (long)pvVar9;
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar3 = false;
        for (iVar5 = 0; iVar5 < this_02->m_height; iVar5 = iVar5 + 1) {
          __n = (this_02->m_pixels).m_ptr;
          for (iVar10 = 0; iVar10 < this_02->m_width; iVar10 = iVar10 + 1) {
            uVar2 = *(uint *)((long)__n + (long)(this_02->m_width * iVar5 + iVar10) * 4);
            if ((uVar2 & 0xff00) < 0xf700 || 0x80000 < (uVar2 & 0xff0000)) {
              *(undefined4 *)
               ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar5 + iVar10) * 4) =
                   0xff0000ff;
              bVar3 = true;
            }
          }
        }
        if (bVar3) {
          local_318._0_8_ =
               ((local_468->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_318 + 8));
          std::operator<<((ostream *)(local_318 + 8),
                          "Image verification failed, found invalid pixels.");
          pTVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_318,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_440,"ImageVerification",&local_469);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"Image verification",&local_46a);
          tcu::LogImageSet::LogImageSet(&local_100,(string *)local_440,&local_408);
          iVar5 = (int)pTVar7;
          tcu::LogImageSet::write(&local_100,iVar5,__buf,(size_t)__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_388,"Result",&local_46b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"Rendered result",&local_46c);
          pCVar8 = &local_368;
          tcu::Surface::getAccess(pCVar8,this_02);
          tcu::LogImage::LogImage
                    ((LogImage *)&vao,&local_388,&local_3a8,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&vao,iVar5,__buf_00,(size_t)pCVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"ErrorMask",&local_46d);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"Error mask",&local_46e);
          pCVar8 = &local_340;
          tcu::Surface::getAccess((PixelBufferAccess *)pCVar8,&errorMask);
          tcu::LogImage::LogImage
                    (&local_c0,&local_3c8,&local_3e8,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_c0,iVar5,__buf_01,(size_t)pCVar8);
          tcu::TestLog::endImageSet(pTVar7);
          tcu::LogImage::~LogImage(&local_c0);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::string::~string((string *)&local_3c8);
          tcu::LogImage::~LogImage((LogImage *)&vao);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_388);
          tcu::LogImageSet::~LogImageSet(&local_100);
          std::__cxx11::string::~string((string *)&local_408);
          pCVar8 = (ConstPixelBufferAccess *)local_440;
        }
        else {
          local_318._0_8_ =
               ((local_468->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_318 + 8));
          std::operator<<((ostream *)(local_318 + 8),"Image valid.");
          pTVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_318,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,"ImageVerification",(allocator<char> *)&local_388);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_340,"Image verification",(allocator<char> *)&local_3a8);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_c0,(string *)&local_368,(string *)&local_340);
          tcu::LogImageSet::write((LogImageSet *)&local_c0,(int)pTVar7,__buf_02,(size_t)__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_440,"Result",(allocator<char> *)&local_3c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"Rendered result",(allocator<char> *)&local_3e8);
          __return_storage_ptr__ = &local_100;
          tcu::Surface::getAccess((ConstPixelBufferAccess *)__return_storage_ptr__,this_02);
          tcu::LogImage::LogImage
                    ((LogImage *)&vao,(string *)local_440,&local_408,
                     (ConstPixelBufferAccess *)__return_storage_ptr__,QP_IMAGE_COMPRESSION_MODE_BEST
                    );
          tcu::LogImage::write((LogImage *)&vao,(int)pTVar7,__buf_03,(size_t)__return_storage_ptr__)
          ;
          tcu::TestLog::endImageSet(pTVar7);
          tcu::LogImage::~LogImage((LogImage *)&vao);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)local_440);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_c0);
          std::__cxx11::string::~string((string *)&local_340);
          pCVar8 = &local_368;
        }
        std::__cxx11::string::~string((string *)pCVar8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_318 + 8));
        tcu::Surface::~Surface(&errorMask);
        bVar11 = (bool)(bVar11 & (bVar3 ^ 1U));
        pvVar9 = (void *)((long)local_460 + 1);
      }
      description = "Image verification failed";
      if (bVar11) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_468->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(byte)~bVar11,description);
      std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector(&renderedLayers);
      return STOP;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"got GL_OUT_OF_MEMORY while drawing");
    *(undefined ***)this_01 = &PTR__runtime_error_01e62e00;
    __cxa_throw(this_01,&Stress::(anonymous_namespace)::AllowedRenderFailureException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_318,"Attribute a_position location was -1",(allocator<char> *)&local_c0
            );
  tcu::TestError::TestError(this_00,(string *)local_318);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GridRenderCase::IterateResult GridRenderCase::iterate (void)
{
	std::vector<tcu::Surface>	renderedLayers	(m_numLayers);
	bool						allLayersOk		= true;

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		renderedLayers[ndx].setSize(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)." << tcu::TestLog::EndMessage;

	try
	{
		renderTo(renderedLayers);
	}
	catch (const AllowedRenderFailureException& ex)
	{
		// Got accepted failure
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Could not render, reason: " << ex.what() << "\n"
			<< "Failure is allowed."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		allLayersOk &= verifyResultLayer(ndx, renderedLayers[ndx]);

	if (allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	return STOP;
}